

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O2

Value * __thiscall
duckdb::KeyValueSecretReader::GetSecretKeyOrSetting
          (Value *__return_storage_ptr__,KeyValueSecretReader *this,string *secret_key,
          string *setting_name)

{
  SettingLookupResult SVar1;
  LogicalType local_40;
  
  LogicalType::LogicalType(&local_40,SQLNULL);
  Value::Value(__return_storage_ptr__,&local_40);
  LogicalType::~LogicalType(&local_40);
  SVar1 = TryGetSecretKeyOrSetting(this,secret_key,setting_name,__return_storage_ptr__);
  if (SVar1.scope != INVALID) {
    return __return_storage_ptr__;
  }
  ThrowNotFoundError(this,secret_key,setting_name);
}

Assistant:

Value KeyValueSecretReader::GetSecretKeyOrSetting(const string &secret_key, const string &setting_name) {
	Value result;
	if (TryGetSecretKeyOrSetting(secret_key, setting_name, result)) {
		return result;
	}
	ThrowNotFoundError(secret_key, setting_name);
}